

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O2

MainLoopResult * __thiscall
Saturation::SaturationAlgorithm::runImpl
          (MainLoopResult *__return_storage_ptr__,SaturationAlgorithm *this)

{
  ulong uVar1;
  long lVar2;
  TimeLimitExceededException *this_00;
  pointer_____offset_0x10___ *ppuVar3;
  
  uVar1 = Lib::Timer::elapsedDeciseconds();
  *(undefined4 *)(DAT_00a141a0 + 0x1d0) = 0;
  while( true ) {
    doOneAlgorithmStep(this);
    if ((this->_activationLimit != 0) && (this->_activationLimit < *(uint *)(DAT_00a141a0 + 0x1d0)))
    break;
    if (this->_softTimeLimit != 0) {
      lVar2 = Lib::Timer::elapsedDeciseconds();
      if ((long)(ulong)this->_softTimeLimit < (long)(lVar2 - (uVar1 & 0xffffffff))) {
        this_00 = (TimeLimitExceededException *)__cxa_allocate_exception(0x28);
        Lib::TimeLimitExceededException::TimeLimitExceededException(this_00);
        ppuVar3 = &Lib::TimeLimitExceededException::typeinfo;
LAB_00507da2:
        __cxa_throw(this_00,ppuVar3,Lib::Exception::~Exception);
      }
    }
  }
  this_00 = (TimeLimitExceededException *)__cxa_allocate_exception(0x28);
  Lib::ActivationLimitExceededException::ActivationLimitExceededException
            ((ActivationLimitExceededException *)this_00);
  ppuVar3 = &Lib::ActivationLimitExceededException::typeinfo;
  goto LAB_00507da2;
}

Assistant:

MainLoopResult SaturationAlgorithm::runImpl()
{
  // could be more precise, but we don't care too much
  unsigned startTime = Timer::elapsedDeciseconds();
  try {
    env.statistics->activations = 0;
    while (true) {
      doOneAlgorithmStep(); // will bump env.statistics->activations by one

      if (_activationLimit && env.statistics->activations > _activationLimit) {
        throw ActivationLimitExceededException();
      }
      if(_softTimeLimit && Timer::elapsedDeciseconds() - startTime > _softTimeLimit)
        throw TimeLimitExceededException();
    }
  }
  catch (ThrowableBase&) {
    tryUpdateFinalClauseCount();
    throw;
  }
}